

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ManPropagateFlow(Jf_Man_t *p,int fEdge)

{
  int iVar1;
  bool bVar2;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  int fEdge_local;
  Jf_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < p->pGia->nObjs) {
      pGStack_20 = Gia_ManObj(p->pGia,local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsBuf(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pGStack_20);
      if ((iVar1 != 0) && (iVar1 = Jf_ObjIsUnit(pGStack_20), iVar1 != 0)) {
        Jf_ObjComputeBestCut(p,pGStack_20,fEdge,0);
      }
    }
    else {
      Jf_ObjPropagateBuf(p,pGStack_20,0);
    }
    local_24 = local_24 + 1;
  }
  Jf_ManComputeRefs(p);
  return;
}

Assistant:

void Jf_ManPropagateFlow( Jf_Man_t * p, int fEdge )
{
    Gia_Obj_t * pObj; 
    int i;
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Jf_ObjPropagateBuf( p, pObj, 0 );
        else if ( Gia_ObjIsAnd(pObj) && Jf_ObjIsUnit(pObj) )
            Jf_ObjComputeBestCut( p, pObj, fEdge, 0 );
    Jf_ManComputeRefs( p );
}